

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_type_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateTypeInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateTypeInfo *this)

{
  idx_t iVar1;
  LogicalTypeId LVar2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var4;
  long *plVar5;
  pointer pSVar6;
  NotImplementedException *this_00;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  idx_t index;
  LogicalType *this_01;
  optional_ptr<duckdb::ExtraTypeInfo,_true> extra_info;
  string local_e8;
  idx_t local_c8;
  Value local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  long lStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  Vector *local_58;
  string local_50;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4ed193b + 9);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).temporary == true) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_c0.type_._0_8_ =
         &local_c0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"CREATE TEMPORARY TYPE can\'t be parsed currently","");
    NotImplementedException::NotImplementedException(this_00,(string *)&local_c0);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,anon_var_dwarf_4ed193b + 9);
  }
  else {
    pcVar3 = (this->super_CreateInfo).catalog._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar3,pcVar3 + (this->super_CreateInfo).catalog._M_string_length
              );
  }
  ParseInfo::QualifierToString
            ((string *)&local_c0,&local_e8,&(this->super_CreateInfo).schema,&this->name);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_c0.type_._0_8_);
  pp_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_c0.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_c0.type_._0_8_ != pp_Var4) {
    operator_delete((void *)local_c0.type_._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  LVar2 = (this->type).id_;
  if (LVar2 == INVALID) {
    pSVar6 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(&this->query);
    (*pSVar6->_vptr_SQLStatement[2])(&local_80);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x1d92e53);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    peVar7 = (element_type *)(plVar5 + 2);
    if ((element_type *)*plVar5 == peVar7) {
      local_e8.field_2._M_allocated_capacity = (size_type)peVar7->_vptr_ExtraTypeInfo;
      local_e8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = (size_type)peVar7->_vptr_ExtraTypeInfo;
      local_e8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e8._M_string_length = plVar5[1];
    *plVar5 = (long)peVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_e8);
    p_Var8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 2);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5 == p_Var8) {
      local_c0.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var8->_M_pi;
      local_c0._24_8_ = plVar5[3];
      local_c0.type_._0_8_ = pp_Var4;
    }
    else {
      local_c0.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var8->_M_pi;
      local_c0.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
    }
    local_c0.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)plVar5[1];
    *plVar5 = (long)p_Var8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_c0.type_._0_8_);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_c0.type_._0_8_ != pp_Var4) {
      operator_delete((void *)local_c0.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    p_Var8 = local_80;
    if (local_80 == &local_70) goto LAB_00e4d2da;
  }
  else {
    if (LVar2 == USER) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_e8._M_dataplus._M_p =
           (pointer)(this->type).type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_e8);
      ParseInfo::QualifierToString
                ((string *)&local_c0,(string *)(local_e8._M_dataplus._M_p + 0x38),
                 (string *)(local_e8._M_dataplus._M_p + 0x58),
                 (string *)(local_e8._M_dataplus._M_p + 0x78));
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_c0.type_._0_8_);
    }
    else {
      this_01 = &this->type;
      if (LVar2 == ENUM) {
        local_58 = EnumType::GetValuesInsertOrder(this_01);
        local_c8 = EnumType::GetSize(this_01);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (local_c8 != 0) {
          iVar1 = local_c8 - 1;
          index = 0;
          do {
            Vector::GetValue(&local_c0,local_58,index);
            Value::ToString_abi_cxx11_(&local_50,&local_c0);
            plVar5 = (long *)::std::__cxx11::string::replace
                                       ((ulong)&local_50,0,(char *)0x0,0x1da22a1);
            p_Var8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 2);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5 == p_Var8) {
              local_70._M_pi = p_Var8->_M_pi;
              lStack_68 = plVar5[3];
              local_80 = &local_70;
            }
            else {
              local_70._M_pi = p_Var8->_M_pi;
              local_80 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
            }
            local_78 = plVar5[1];
            *plVar5 = (long)p_Var8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)::std::__cxx11::string::append((char *)&local_80);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            peVar7 = (element_type *)(plVar5 + 2);
            if ((element_type *)*plVar5 == peVar7) {
              local_e8.field_2._M_allocated_capacity = (size_type)peVar7->_vptr_ExtraTypeInfo;
              local_e8.field_2._8_8_ = plVar5[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = (size_type)peVar7->_vptr_ExtraTypeInfo;
              local_e8._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_e8._M_string_length = plVar5[1];
            *plVar5 = (long)peVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            if (local_80 != &local_70) {
              operator_delete(local_80);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            Value::~Value(&local_c0);
            if (iVar1 != index) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            index = index + 1;
          } while (local_c8 != index);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_00e4d2da;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      LogicalType::ToString_abi_cxx11_((string *)&local_c0,this_01);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_c0.type_._0_8_);
    }
    p_Var8 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c0.type_._0_8_;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_c0.type_._0_8_ == pp_Var4)
    goto LAB_00e4d2da;
  }
  operator_delete(p_Var8);
LAB_00e4d2da:
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CreateTypeInfo::ToString() const {
	string result = "";
	result += "CREATE";
	if (temporary) {
		// These are created by PIVOT
		throw NotImplementedException("CREATE TEMPORARY TYPE can't be parsed currently");
	}
	result += " TYPE ";
	result += QualifierToString(temporary ? "" : catalog, schema, name);
	if (type.id() == LogicalTypeId::ENUM) {
		auto &values_insert_order = EnumType::GetValuesInsertOrder(type);
		idx_t size = EnumType::GetSize(type);

		result += " AS ENUM ( ";
		for (idx_t i = 0; i < size; i++) {
			result += "'" + values_insert_order.GetValue(i).ToString() + "'";
			if (i != size - 1) {
				result += ", ";
			}
		}
		result += " );";
	} else if (type.id() == LogicalTypeId::INVALID) {
		// CREATE TYPE mood AS ENUM (SELECT 'happy')
		D_ASSERT(query);
		result += " AS ENUM (" + query->ToString() + ")";
	} else if (type.id() == LogicalTypeId::USER) {
		result += " AS ";
		auto extra_info = type.AuxInfo();
		D_ASSERT(extra_info);
		D_ASSERT(extra_info->type == ExtraTypeInfoType::USER_TYPE_INFO);
		auto &user_info = extra_info->Cast<UserTypeInfo>();
		result += QualifierToString(user_info.catalog, user_info.schema, user_info.user_type_name);
	} else {
		result += " AS ";
		result += type.ToString();
	}
	result += ";";
	return result;
}